

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall QTextDocumentPrivate::enableUndoRedo(QTextDocumentPrivate *this,bool enable)

{
  byte bVar1;
  byte in_SIL;
  long in_RDI;
  QTextDocumentPrivate *in_stack_00000028;
  undefined4 local_1c;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  if ((bVar1 == 0) || (*(int *)(in_RDI + 0x290) < 1)) {
    if (bVar1 == 0) {
      *(undefined4 *)(in_RDI + 0xbc) = 0;
      clearUndoRedoStacks(in_stack_00000028,this._4_4_,this._3_1_);
      emitUndoAvailable((QTextDocumentPrivate *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                        SUB81((ulong)in_RDI >> 0x38,0));
      emitRedoAvailable((QTextDocumentPrivate *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                        SUB81((ulong)in_RDI >> 0x38,0));
    }
    if ((*(byte *)(in_RDI + 200) & 1) == 0) {
      local_1c = *(undefined4 *)(in_RDI + 0xbc);
    }
    else {
      local_1c = 0xffffffff;
    }
    *(undefined4 *)(in_RDI + 0xc4) = local_1c;
    *(byte *)(in_RDI + 0xb8) = bVar1 & 1;
    if ((*(byte *)(in_RDI + 0xb8) & 1) == 0) {
      compressPieceTable(this);
    }
  }
  return;
}

Assistant:

void QTextDocumentPrivate::enableUndoRedo(bool enable)
{
    if (enable && maximumBlockCount > 0)
        return;

    if (!enable) {
        undoState = 0;
        clearUndoRedoStacks(QTextDocument::RedoStack);
        emitUndoAvailable(false);
        emitRedoAvailable(false);
    }
    modifiedState = modified ? -1 : undoState;
    undoEnabled = enable;
    if (!undoEnabled)
        compressPieceTable();
}